

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::OpenPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiID IVar2;
  undefined4 in_ESI;
  ImGuiWindow *in_RDI;
  ImGuiID id;
  int mouse_button;
  ImGuiWindow *window;
  ImGuiPopupFlags in_stack_00000020;
  ImGuiHoveredFlags in_stack_ffffffffffffffd0;
  ImGuiMouseButton in_stack_ffffffffffffffd4;
  ImGuiWindow *str_end;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  str_end = GImGui->CurrentWindow;
  bVar1 = IsMouseReleased(in_stack_ffffffffffffffd4);
  if ((bVar1) && (bVar1 = IsItemHovered(in_stack_ffffffffffffffd0), bVar1)) {
    if (in_RDI == (ImGuiWindow *)0x0) {
      IVar2 = (str_end->DC).LastItemId;
    }
    else {
      IVar2 = ImGuiWindow::GetID(in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                 (char *)str_end);
    }
    if (IVar2 == 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1eb8,"OpenPopupContextItem","ImGui ASSERT FAILED: %s","id != 0");
    }
    OpenPopupEx(popup_flags,in_stack_00000020);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::OpenPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
        return true;
    }
    return false;
}